

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void __thiscall
libtest::printer::format_rec<char_const*>(printer *this,string *s,usize index,char **t)

{
  ulong index_00;
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  ostream *poVar6;
  char local_3a;
  char local_39;
  char **local_38;
  
  uVar3 = s->_M_string_length;
  local_38 = t;
  if (index < uVar3) {
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar1 = pcVar2[index];
      if (cVar1 == '%') {
        index_00 = index + 1;
        if ((uVar3 <= index_00) || (pcVar2[index_00] != '%')) {
          poVar6 = this->os;
          pcVar5 = *local_38;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar4 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,sVar4);
          }
          format_rec(this,s,index_00);
          return;
        }
        index = index + 2;
        poVar6 = this->os;
        local_3a = '%';
        pcVar5 = &local_3a;
      }
      else {
        poVar6 = this->os;
        index = index + 1;
        pcVar5 = &local_39;
        local_39 = cVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,1);
      uVar3 = s->_M_string_length;
    } while (index < uVar3);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/pachicobue[P]libtest/a_plus_b/../utils/printer.hpp"
                ,0x3f,
                "void libtest::printer::format_rec(const std::string &, usize, const T &, const Args...) [T = const char *, Args = <>]"
               );
}

Assistant:

void format_rec(const std::string& s, usize index, const T& t, const Args... args)
    {
        for (; index < s.size();) {
            if (s[index] == '%') {
                if (index + 1 < s.size() and s[index + 1] == '%') {
                    index += 2, os << '%';
                } else {
                    return os << t, format_rec(s, ++index, args...), static_cast<void>(0);
                }
            } else {
                os << s[index++];
            }
        }
        assert(false);
    }